

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int qwrite(char *file,char *buffer,int n)

{
  int n_local;
  char *buffer_local;
  char *file_local;
  
  if (noutmax < noutchar + n) {
    file_local._4_4_ = 0;
  }
  else {
    memcpy(file + noutchar,buffer,(long)n);
    noutchar = n + noutchar;
    file_local._4_4_ = n;
  }
  return file_local._4_4_;
}

Assistant:

static int
qwrite(char *file, char buffer[], int n){
    /*
     * write n bytes from buffer into file
     * returns number of bytes read (=n) if successful, <=0 if not
     */

     if (noutchar + n > noutmax) return(0);  /* buffer overflow */
     
     memcpy(&file[noutchar], buffer, n);
     noutchar += n;

     return(n);
}